

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureView.h
# Opt level: O0

bool __thiscall Diligent::TextureViewDesc::operator==(TextureViewDesc *this,TextureViewDesc *RHS)

{
  Uint32 UVar1;
  Uint32 UVar2;
  bool local_19;
  TextureViewDesc *RHS_local;
  TextureViewDesc *this_local;
  
  local_19 = false;
  if ((((this->ViewType == RHS->ViewType) && (local_19 = false, this->TextureDim == RHS->TextureDim)
       ) && (local_19 = false, this->Format == RHS->Format)) &&
     ((local_19 = false, this->MostDetailedMip == RHS->MostDetailedMip &&
      (local_19 = false, this->NumMipLevels == RHS->NumMipLevels)))) {
    UVar1 = FirstArrayOrDepthSlice(this);
    UVar2 = FirstArrayOrDepthSlice(RHS);
    local_19 = false;
    if (UVar1 == UVar2) {
      UVar1 = NumArrayOrDepthSlices(this);
      UVar2 = NumArrayOrDepthSlices(RHS);
      local_19 = false;
      if (((UVar1 == UVar2) && (local_19 = false, this->AccessFlags == RHS->AccessFlags)) &&
         (local_19 = false, this->Flags == RHS->Flags)) {
        local_19 = TextureComponentMapping::operator==(&this->Swizzle,&RHS->Swizzle);
      }
    }
  }
  return local_19;
}

Assistant:

constexpr bool operator==(const TextureViewDesc& RHS) const
    {
        // Ignore Name. This is consistent with the hasher (HashCombiner<HasherType, TextureViewDesc>).
        return //strcmp(Name, RHS.Name) == 0            &&
            ViewType                 == RHS.ViewType                 &&
            TextureDim               == RHS.TextureDim               &&
            Format                   == RHS.Format                   &&
            MostDetailedMip          == RHS.MostDetailedMip          &&
            NumMipLevels             == RHS.NumMipLevels             &&
            FirstArrayOrDepthSlice() == RHS.FirstArrayOrDepthSlice() &&
            NumArrayOrDepthSlices()  == RHS.NumArrayOrDepthSlices()  &&
            AccessFlags              == RHS.AccessFlags              &&
            Flags                    == RHS.Flags                    &&
            Swizzle                  == RHS.Swizzle;
    }